

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::Value::~Value(Value *this)

{
  void *pvVar1;
  CommentInfo *pCVar2;
  uint uVar3;
  undefined8 *in_RDI;
  CommentInfo *this_00;
  
  uVar3 = (uint)(ushort)*(byte *)(in_RDI + 1);
  if (3 < *(byte *)(in_RDI + 1)) {
    if (uVar3 == 4) {
      if ((short)(*(short *)(in_RDI + 1) << 7) < 0) {
        releaseStringValue((char *)0x126f40);
      }
    }
    else if (((uVar3 != 5) && (uVar3 - 6 < 2)) && (pvVar1 = (void *)*in_RDI, pvVar1 != (void *)0x0))
    {
      std::
      map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
      ::~map((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              *)0x126f63);
      operator_delete(pvVar1);
    }
  }
  if ((in_RDI[2] != 0) && (pCVar2 = (CommentInfo *)in_RDI[2], pCVar2 != (CommentInfo *)0x0)) {
    this_00 = pCVar2 + (long)pCVar2[-1].comment_;
    while (pCVar2 != this_00) {
      this_00 = this_00 + -1;
      CommentInfo::~CommentInfo(this_00);
    }
    operator_delete__(pCVar2 + -1);
  }
  return;
}

Assistant:

Value::~Value() {
  switch (type_) {
  case nullValue:
  case intValue:
  case uintValue:
  case realValue:
  case booleanValue:
    break;
  case stringValue:
    if (allocated_)
      releaseStringValue(value_.string_);
    break;
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  case arrayValue:
  case objectValue:
    delete value_.map_;
    break;
#else
  case arrayValue:
    arrayAllocator()->destructArray(value_.array_);
    break;
  case objectValue:
    mapAllocator()->destructMap(value_.map_);
    break;
#endif
  default:
    JSON_ASSERT_UNREACHABLE;
  }

  if (comments_)
    delete[] comments_;
}